

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::(anonymous_namespace)::
unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
::
insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>,long&,long*>>
          (unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
           *this,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                 b,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                   e)

{
  bool bVar1;
  reference x;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>,_bool>
  local_48;
  unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
  *local_30;
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  *this_local;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  e_local;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  b_local;
  
  this_local = (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
                *)e.node;
  e_local._8_8_ = b.node;
  e_local.node._0_4_ = e.position;
  local_30 = this;
  while( true ) {
    bVar1 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
            ::operator!=((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                          *)&e_local.position,(iterator *)&this_local);
    if (!bVar1) break;
    x = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
        ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                     *)&e_local.position);
    anon_unknown_0::
    unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
    ::insert(&local_48,
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)this,x);
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
    ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
                  *)&e_local.position);
  }
  return;
}

Assistant:

void insert(InputIterator b, InputIterator e) {
            for (; b != e; ++b) {
                insert(*b);
            }
        }